

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

string * __thiscall
t_ocaml_generator::struct_member_copy_of
          (string *__return_storage_ptr__,t_ocaml_generator *this,t_type *type,string *what)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  t_type *ptVar4;
  allocator local_541;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  allocator local_519;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  allocator local_4f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  allocator local_469;
  string local_468;
  undefined1 local_448 [8];
  string copy_of_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  allocator local_3f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  allocator local_3d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  allocator local_329;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  allocator local_301;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  allocator local_2b9;
  string local_2b8;
  undefined1 local_298 [8];
  string copy_of;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  allocator local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  allocator local_221;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined4 local_160;
  allocator local_159;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  allocator local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  allocator local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  string copy_of_v;
  string local_a0;
  undefined1 local_80 [8];
  string copy_of_k;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *what_local;
  t_type *type_local;
  t_ocaml_generator *this_local;
  
  local_28 = what;
  what_local = (string *)type;
  type_local = (t_type *)this;
  this_local = (t_ocaml_generator *)__return_storage_ptr__;
  uVar2 = (*(type->super_t_doc)._vptr_t_doc[0xb])();
  if (((uVar2 & 1) == 0) && (uVar3 = (**(code **)(*(long *)what_local + 0x60))(), (uVar3 & 1) == 0))
  {
    uVar3 = (**(code **)(*(long *)what_local + 0x80))();
    if ((uVar3 & 1) == 0) {
      uVar3 = (**(code **)(*(long *)what_local + 0x78))();
      if ((uVar3 & 1) == 0) {
        uVar3 = (**(code **)(*(long *)what_local + 0x70))();
        if ((uVar3 & 1) == 0) {
          std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)what);
        }
        else {
          ptVar4 = t_list::get_elem_type((t_list *)what_local);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_468,"x",&local_469);
          struct_member_copy_of((string *)local_448,this,ptVar4,&local_468);
          std::__cxx11::string::~string((string *)&local_468);
          std::allocator<char>::~allocator((allocator<char> *)&local_469);
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_448,"x");
          if (bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_4f0,"(List.map (fun x -> ",&local_4f1);
            std::operator+(&local_4d0,&local_4f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_448);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_518,") ",&local_519);
            std::operator+(&local_4b0,&local_4d0,&local_518);
            std::operator+(&local_490,&local_4b0,what);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_540,")",&local_541);
            std::operator+(__return_storage_ptr__,&local_490,&local_540);
            std::__cxx11::string::~string((string *)&local_540);
            std::allocator<char>::~allocator((allocator<char> *)&local_541);
            std::__cxx11::string::~string((string *)&local_490);
            std::__cxx11::string::~string((string *)&local_4b0);
            std::__cxx11::string::~string((string *)&local_518);
            std::allocator<char>::~allocator((allocator<char> *)&local_519);
            std::__cxx11::string::~string((string *)&local_4d0);
            std::__cxx11::string::~string((string *)&local_4f0);
            std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
          }
          else {
            std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)what);
          }
          local_160 = 1;
          std::__cxx11::string::~string((string *)local_448);
        }
      }
      else {
        ptVar4 = t_set::get_elem_type((t_set *)what_local);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2b8,"k",&local_2b9);
        struct_member_copy_of((string *)local_298,this,ptVar4,&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_298,"k");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_300,"(Hashtbl.copy ",&local_301);
          std::operator+(&local_2e0,&local_300,what);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_328,")",&local_329);
          std::operator+(__return_storage_ptr__,&local_2e0,&local_328);
          std::__cxx11::string::~string((string *)&local_328);
          std::allocator<char>::~allocator((allocator<char> *)&local_329);
          std::__cxx11::string::~string((string *)&local_2e0);
          std::__cxx11::string::~string((string *)&local_300);
          std::allocator<char>::~allocator((allocator<char> *)&local_301);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_3d0,
                     "((fun oh -> let nh = Hashtbl.create (Hashtbl.length oh) in Hashtbl.iter (fun k v -> Hashtbl.add nh "
                     ,&local_3d1);
          std::operator+(&local_3b0,&local_3d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_298);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_3f8," true",&local_3f9);
          std::operator+(&local_390,&local_3b0,&local_3f8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_420,") oh; nh) ",
                     (allocator *)(copy_of_1.field_2._M_local_buf + 0xf));
          std::operator+(&local_370,&local_390,&local_420);
          std::operator+(&local_350,&local_370,what);
          std::operator+(__return_storage_ptr__,&local_350,")");
          std::__cxx11::string::~string((string *)&local_350);
          std::__cxx11::string::~string((string *)&local_370);
          std::__cxx11::string::~string((string *)&local_420);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(copy_of_1.field_2._M_local_buf + 0xf));
          std::__cxx11::string::~string((string *)&local_390);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
          std::__cxx11::string::~string((string *)&local_3b0);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
        }
        local_160 = 1;
        std::__cxx11::string::~string((string *)local_298);
      }
    }
    else {
      ptVar4 = t_map::get_key_type((t_map *)what_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_a0,"k",(allocator *)(copy_of_v.field_2._M_local_buf + 0xf));
      struct_member_copy_of((string *)local_80,this,ptVar4,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator((allocator<char> *)(copy_of_v.field_2._M_local_buf + 0xf));
      ptVar4 = t_map::get_val_type((t_map *)what_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e8,"v",&local_e9);
      struct_member_copy_of((string *)local_c8,this,ptVar4,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_80,"k");
      if ((bVar1) &&
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_c8,"v"), bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_130,"(Hashtbl.copy ",&local_131);
        std::operator+(&local_110,&local_130,what);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_158,")",&local_159);
        std::operator+(__return_storage_ptr__,&local_110,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::allocator<char>::~allocator((allocator<char> *)&local_131);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_220,
                   "((fun oh -> let nh = Hashtbl.create (Hashtbl.length oh) in Hashtbl.iter (fun k v -> Hashtbl.add nh "
                   ,&local_221);
        std::operator+(&local_200,&local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_248," ",&local_249);
        std::operator+(&local_1e0,&local_200,&local_248);
        std::operator+(&local_1c0,&local_1e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                      );
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_270,") oh; nh) ",
                   (allocator *)(copy_of.field_2._M_local_buf + 0xf));
        std::operator+(&local_1a0,&local_1c0,&local_270);
        std::operator+(&local_180,&local_1a0,what);
        std::operator+(__return_storage_ptr__,&local_180,")");
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_270);
        std::allocator<char>::~allocator((allocator<char> *)(copy_of.field_2._M_local_buf + 0xf));
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_248);
        std::allocator<char>::~allocator((allocator<char> *)&local_249);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator((allocator<char> *)&local_221);
      }
      local_160 = 1;
      std::__cxx11::string::~string((string *)local_c8);
      std::__cxx11::string::~string((string *)local_80);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"#copy",&local_49);
    std::operator+(__return_storage_ptr__,what,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_ocaml_generator::struct_member_copy_of(t_type* type, string what) {
  if (type->is_struct() || type->is_xception()) {
    return what + string("#copy");
  }
  if (type->is_map()) {
    string copy_of_k = struct_member_copy_of(((t_map*)type)->get_key_type(), "k");
    string copy_of_v = struct_member_copy_of(((t_map*)type)->get_val_type(), "v");

    if (copy_of_k == "k" && copy_of_v == "v") {
      return string("(Hashtbl.copy ") + what + string(")");
    } else {
      return string(
                 "((fun oh -> let nh = Hashtbl.create (Hashtbl.length oh) in Hashtbl.iter (fun k v "
                 "-> Hashtbl.add nh ") + copy_of_k + string(" ") + copy_of_v + string(") oh; nh) ")
             + what + ")";
    }
  }
  if (type->is_set()) {
    string copy_of = struct_member_copy_of(((t_set*)type)->get_elem_type(), "k");

    if (copy_of == "k") {
      return string("(Hashtbl.copy ") + what + string(")");
    } else {
      return string(
                 "((fun oh -> let nh = Hashtbl.create (Hashtbl.length oh) in Hashtbl.iter (fun k v "
                 "-> Hashtbl.add nh ") + copy_of + string(" true") + string(") oh; nh) ") + what
             + ")";
    }
  }
  if (type->is_list()) {
    string copy_of = struct_member_copy_of(((t_list*)type)->get_elem_type(), "x");
    if (copy_of != "x") {
      return string("(List.map (fun x -> ") + copy_of + string(") ") + what + string(")");
    } else {
      return what;
    }
  }
  return what;
}